

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  ulong uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  char c;
  int n;
  priority_queue<int,_std::less<int>_> pq;
  byte local_55;
  int local_54;
  priority_queue<int,_std::less<int>_> local_50;
  
  local_50.mData = (int *)operator_new__(4);
  *local_50.mData = 0;
  local_50.mCap = 1;
  local_50.mSize = 0;
  do {
    while( true ) {
      while( true ) {
        __isoc99_scanf("%c",&local_55);
        if (0x67 < local_55) break;
        if (local_55 == 0x61) {
          __isoc99_scanf("%d",&local_54);
          CP::priority_queue<int,_std::less<int>_>::push(&local_50,&local_54);
        }
        else if (local_55 == 100) {
          CP::priority_queue<int,_std::less<int>_>::pop(&local_50);
        }
      }
      if (local_55 != 0x68) break;
      if (local_50.mSize == 0) {
        uVar1 = 0xffffffff;
      }
      else {
        auVar3._8_4_ = (int)(local_50.mSize >> 0x20);
        auVar3._0_8_ = local_50.mSize;
        auVar3._12_4_ = 0x45300000;
        dVar2 = log2((auVar3._8_8_ - 1.9342813113834067e+25) +
                     ((double)CONCAT44(0x43300000,(int)local_50.mSize) - 4503599627370496.0));
        uVar1 = (ulong)(uint)(int)dVar2;
      }
      printf("Binary Heap with %d nodes has height %d\n",local_50.mSize & 0xffffffff,uVar1);
    }
  } while (local_55 != 0x71);
  if (local_50.mData != (int *)0x0) {
    operator_delete__(local_50.mData);
  }
  return 0;
}

Assistant:

int main() {
  CP::priority_queue<int> pq;
  char c;
  scanf("%c", &c);
  while (c != 'q') {
    if (c == 'a') {
      // add data
      int n;
      scanf("%d", &n);
      pq.push(n);
    } else if (c == 'h') {
      int r = pq.height();
      int n = pq.size();
      printf("Binary Heap with %d nodes has height %d\n",n,r);
    } else if (c == 'd') {
       pq.pop();
    }
    scanf("%c", &c);
  }
  return 0;
}